

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall
Parser::ParseFncDeclHelper<false>
          (Parser *this,ParseNodeFnc *pnodeFnc,LPCOLESTR pNameHint,ushort flags,bool fUnaryOrParen,
          bool noStmtContext,bool *pNeedScanRCurly,bool skipFormals,IdentPtr *pFncNamePid,
          bool fAllowIn)

{
  ParseNodePtr *ppPVar1;
  Scanner_t *this_00;
  byte *pbVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ParseNodeFnc *pnodeFncParent;
  StmtNest *pSVar9;
  ParseNodePtr *ppPVar10;
  DeferredFunctionStub *pDVar11;
  code *pcVar12;
  uint uVar13;
  byte bVar14;
  anon_class_24_3_9004dee7 fn;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  uint uVar19;
  undefined4 *puVar20;
  ParseNodeFnc *pnodeFncParent_00;
  ParseNodeBlock *pnodeBlock;
  ParseNodeBlock *pnodeBlock_00;
  ParseNodePtr *ppPVar21;
  IdentPtr pid;
  ParseNodeFnc *pPVar22;
  undefined8 extraout_RAX;
  char16_t *pcVar23;
  Parser *pPVar24;
  ParseNodePtr *ppnodeVarSave;
  Scope *pSVar25;
  undefined1 auStack_188 [8];
  RestorePoint beginNameHint;
  undefined1 auStack_148 [8];
  RestorePoint beginFormals;
  undefined1 auStack_108 [8];
  RestorePoint afterFnc;
  ParseNodePtr *local_78;
  ParseNodeVar *local_70;
  ParseNodeBlock *local_50;
  bool local_36;
  bool local_35;
  uint local_34;
  bool strictModeTurnedOn;
  
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x15db,"(pnodeFnc)","pnodeFnc");
    if (!bVar15) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  pnodeFncParent_00 = GetCurrentFunctionNode(this);
  pPVar22 = this->m_currentNodeNonLambdaDeferredFunc;
  pnodeFncParent = this->m_currentNodeDeferredFunc;
  uVar13 = (uint)flags;
  beginNameHint.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
  beginNameHint.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
  beginNameHint.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
  auStack_188._0_4_ = 0xffffffff;
  auStack_188._4_4_ = 0xffffffff;
  beginNameHint.m_ichMinTok = 0xffffffff;
  beginNameHint.m_ichMinLine = 0xffffffff;
  beginNameHint._20_16_ = (undefined1  [16])0x0;
  beginNameHint.m_fHadEol = -1;
  beginNameHint._44_4_ = 0xffffffff;
  this_00 = &this->m_scan;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_188);
  local_34 = uVar13;
  if ((flags & 1) == 0) {
    if ((flags & 0x10) == 0) {
      local_50 = StartParseBlock<false>(this,Function,ScopeType_FuncExpr,(LabelId *)0x0);
      pSVar25 = local_50->scope;
    }
    else {
      pSVar25 = (Scope *)0x0;
      local_50 = (ParseNodeBlock *)0x0;
    }
    UpdateCurrentNodeFunc<false>(this,pnodeFnc,SUB41((local_34 & 0x10) >> 4,0));
  }
  else {
    pSVar25 = (Scope *)0x0;
    local_50 = (ParseNodeBlock *)0x0;
  }
  if ((flags & 0x210) == 0) {
    ParseFncName<false>(this,pnodeFnc,(ushort)local_34,pFncNamePid);
  }
  if ((local_34 & 1) != 0) {
    UpdateCurrentNodeFunc<false>(this,pnodeFnc,SUB41((local_34 & 0x10) >> 4,0));
  }
  uVar13 = local_34;
  bVar14 = (byte)(pnodeFnc->fncFlags >> 0x18);
  if ((noStmtContext & bVar14 >> 1 & 1) == 1) {
    Error(this,-0x7ff5fc16,&pnodeFnc->super_ParseNode);
  }
  bVar15 = (this->m_scan).m_fYieldIsKeywordRegion;
  bVar3 = (this->m_scan).m_fAwaitIsKeywordRegion;
  (this->m_scan).m_fYieldIsKeywordRegion = (bool)(bVar14 >> 1 & 1);
  (this->m_scan).m_fAwaitIsKeywordRegion = (bool)((byte)(flags >> 8) & 1);
  if (pSVar25 == (Scope *)0x0) {
    pSVar25 = (Scope *)0x0;
  }
  else if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
    FinishParseBlock(this,local_50,true);
    this->m_nextBlockId = this->m_nextBlockId + -1;
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Scope>
              (&this->m_nodeAllocator,pSVar25);
    pSVar25 = (Scope *)0x0;
    local_50 = (ParseNodeBlock *)0x0;
  }
  pnodeFnc->scope = pSVar25;
  pSVar9 = this->m_pstmtCur;
  this->m_pstmtCur = (StmtNest *)0x0;
  beginFormals.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
  beginFormals.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
  beginFormals.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
  auStack_148._0_4_ = 0xffffffff;
  auStack_148._4_4_ = 0xffffffff;
  beginFormals.m_ichMinTok = 0xffffffff;
  beginFormals.m_ichMinLine = 0xffffffff;
  beginFormals._20_16_ = (undefined1  [16])0x0;
  beginFormals.m_fHadEol = -1;
  beginFormals._44_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_148);
  bVar16 = IsStrictMode(this);
  BVar4 = this->m_fUseStrictMode;
  uVar5 = this->m_grfscr;
  local_35 = this->m_doingFastScan;
  pnodeBlock = StartParseBlock<false>(this,Parameter,ScopeType_Parameter,(LabelId *)0x0);
  if (pnodeBlock == (ParseNodeBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x169d,"(pnodeBlock != nullptr)","pnodeBlock != nullptr");
    if (!bVar17) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  pnodeFnc->pnodeScopes = pnodeBlock;
  this->m_ppnodeVar = &pnodeFnc->pnodeParams;
  ppPVar1 = &pnodeFnc->pnodeVars;
  pnodeFnc->pnodeVars = (ParseNodePtr)0x0;
  if ((flags & 0x210) == 0) {
    this->m_ppnodeVar = ppPVar1;
    local_70 = AddArgumentsNodeToVars(this,pnodeFnc);
    local_78 = this->m_ppnodeVar;
    this->m_ppnodeVar = &pnodeFnc->pnodeParams;
  }
  else {
    local_70 = (ParseNodeVar *)0x0;
    local_78 = ppPVar1;
  }
  ppPVar10 = this->m_ppnodeScope;
  if (pnodeBlock != (ParseNodeBlock *)0x0) {
    this->m_ppnodeScope = &pnodeBlock->pnodeScopes;
    pnodeBlock->pnodeStmt = &pnodeFnc->super_ParseNode;
  }
  ppPVar21 = this->m_ppnodeExprScope;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  uVar6 = this->m_funcParenExprDepth;
  this->m_funcParenExprDepth = 0;
  if (!skipFormals) {
    bVar17 = this->m_reparsingLambdaParams;
    if ((uVar13 & 0x10) != 0) {
      this->m_reparsingLambdaParams = true;
    }
    uVar7 = this->m_currDeferredStubCount;
    pDVar11 = this->m_currDeferredStub;
    ShiftCurrDeferredStubToChildFunction(this,pnodeFnc,pnodeFncParent_00);
    ParseFncFormals<false>(this,pnodeFnc,pnodeFncParent_00,(ushort)local_34,false);
    this->m_currDeferredStub = pDVar11;
    this->m_currDeferredStubCount = uVar7;
    this->m_reparsingLambdaParams = bVar17;
  }
  pnodeBlock_00 = StartParseBlock<false>(this,Function,ScopeType_FunctionBody,(LabelId *)0x0);
  *this->m_ppnodeScope = (ParseNodePtr)pnodeBlock_00;
  pnodeFnc->pnodeBodyScope = pnodeBlock_00;
  this->m_ppnodeScope = &pnodeBlock_00->pnodeScopes;
  pnodeBlock_00->pnodeStmt = &pnodeFnc->super_ParseNode;
  local_36 = false;
  if ((pnodeFnc->pnodeScopes != (ParseNodeBlock *)0x0) &&
     (pSVar25 = pnodeFnc->pnodeScopes->scope, pSVar25 != (Scope *)0x0)) {
    if (DAT_0143bfaa == '\x01') {
      pnodeFnc->isBodyAndParamScopeMerged = false;
    }
    else if (((pnodeFnc->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone) &&
            (pnodeFnc->isBodyAndParamScopeMerged == true)) {
      fn.paramScope = pSVar25;
      fn.this = this;
      fn.pnodeFnc = pnodeFnc;
      Scope::
      ForEachSymbolUntil<Parser::ParseFncDeclHelper<false>(ParseNodeFnc*,char16_t_const*,unsigned_short,bool,bool,bool*,bool,Ident**,bool)::_lambda(Symbol*)_1_>
                (pSVar25,fn);
    }
    if (pnodeFnc->isBodyAndParamScopeMerged == true) {
      Scope::
      ForEachSymbol<Parser::ParseFncDeclHelper<false>(ParseNodeFnc*,char16_t_const*,unsigned_short,bool,bool,bool*,bool,Ident**,bool)::_lambda(Symbol*)_2_>
                (pSVar25,(anon_class_8_1_8991fb9c)this);
    }
  }
  if (this->m_funcParenExprDepth != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x172c,"(m_funcParenExprDepth == 0)",
                        "Paren exprs should have been resolved by the time we finish function formals"
                       );
    if (!bVar17) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  if ((this->m_token).tk == tkRParen) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  uVar13 = local_34;
  if ((local_34 & 0x10) != 0) {
    iVar8 = (this->m_scan).m_fHadEol;
    pPVar24 = this;
    ChkCurTok(this,0x55,-0x7ff5fbda);
    if (iVar8 != 0) {
      Error(pPVar24,-0x7ff5fb4b,L"Lambda parameter list",L"\'=>\' on the same line");
    }
  }
  if ((this->m_InAsmMode == true) && (this->m_deferAsmJs == true)) {
    bVar17 = true;
    ParseTopLevelDeferredFunc
              (this,pnodeFnc,pnodeFncParent,pNameHint,SUB41((uVar13 & 0x10) >> 4,0),pNeedScanRCurly,
               fAllowIn);
  }
  else {
    if (*this->m_ppnodeVar != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar20 = 1;
      bVar17 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x175d,"(*m_ppnodeVar == nullptr)","*m_ppnodeVar == nullptr");
      if (!bVar17) goto LAB_00cf7ef5;
      *puVar20 = 0;
    }
    this->m_ppnodeVar = local_78;
    if (pnodeFnc->isBodyAndParamScopeMerged == false) {
      if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
        pcVar23 = L"Anonymous function";
      }
      else {
        pcVar23 = (char16_t *)&pnodeFnc->pnodeName->pid->field_0x22;
      }
      Output::TraceWithFlush
                (ParsePhase,L"The param and body scope of the function %s cannot be merged\n",
                 pcVar23);
    }
    this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
    ParseNestedDeferredFunc
              (this,pnodeFnc,SUB41((local_34 & 0x10) >> 4,0),pNeedScanRCurly,&local_36,fAllowIn);
    bVar17 = false;
  }
  this->m_funcParenExprDepth = uVar6;
  pPVar24 = this;
  FinishParseBlock(this,pnodeBlock_00,*pNeedScanRCurly);
  if (((local_34 >> 9 & 1) == 0) && (((local_34 & 0x10) == 0 || ((this->m_token).tk == tkLCurly))))
  {
    UpdateArgumentsNode(pPVar24,pnodeFnc,local_70);
  }
  CreateSpecialSymbolDeclarations(this,pnodeFnc);
  if ((this->m_ppnodeExprScope != (ParseNodePtr *)0x0) &&
     (*this->m_ppnodeExprScope != (ParseNodePtr)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1791,"(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr)",
                        "m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr");
    if (!bVar18) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  this->m_ppnodeExprScope = ppPVar21;
  ppPVar21 = this->m_ppnodeScope;
  if (ppPVar21 == (ParseNodePtr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1794,"(m_ppnodeScope)","m_ppnodeScope");
    if (!bVar18) goto LAB_00cf7ef5;
    *puVar20 = 0;
    ppPVar21 = this->m_ppnodeScope;
  }
  if (*ppPVar21 != (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1795,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope");
    if (!bVar18) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  this->m_ppnodeScope = ppPVar10;
  if (pnodeBlock != (ParseNodeBlock *)0x0) {
    FinishParseBlock(this,pnodeBlock,*pNeedScanRCurly);
  }
  bVar18 = IsStrictMode(this);
  if ((bVar18) || (local_36 == true)) {
    this->m_fUseStrictMode = 1;
    if (!bVar16) {
      afterFnc.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      afterFnc.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      afterFnc.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_108._0_4_ = 0xffffffff;
      auStack_108._4_4_ = 0xffffffff;
      afterFnc.m_ichMinTok = 0xffffffff;
      afterFnc.m_ichMinLine = 0xffffffff;
      afterFnc._20_16_ = (undefined1  [16])0x0;
      afterFnc.m_fHadEol = -1;
      afterFnc._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_108);
      if (pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_188);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
        if ((pnodeFnc->fncFlags & kFunctionIsGenerator) != kFunctionNone) {
          if ((this->m_token).tk != tkStar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar20 = 1;
            bVar16 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17af,"(m_token.tk == tkStar)","m_token.tk == tkStar");
            if (!bVar16) goto LAB_00cf7ef5;
            *puVar20 = 0;
          }
          if (((this->m_scriptContext->config).threadConfig)->m_ES6Generators == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar20 = 1;
            bVar16 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17b0,"(m_scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "m_scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
            if (!bVar16) goto LAB_00cf7ef5;
            *puVar20 = 0;
          }
          if ((local_34 & 0x40) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar20 = 1;
            bVar16 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17b1,"(!(flags & fFncClassMember))","!(flags & fFncClassMember)")
            ;
            if (!bVar16) goto LAB_00cf7ef5;
            *puVar20 = 0;
          }
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
        }
        if ((int)(this->m_token).tk < 0x4e) {
          IdentifierExpectedError(this,&this->m_token);
          this->m_doingFastScan = local_35;
          _Unwind_Resume(extraout_RAX);
        }
        pid = Token::GetIdentifier((Token *)&this->m_token,&(this->m_scan).m_htbl);
        CheckStrictModeEvalArgumentsUsage(this,pid,(ParseNodePtr)0x0);
      }
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekToForcingPid(this_00,(RestorePoint *)auStack_148)
      ;
      CheckStrictFormalParameters(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_108);
    }
    this->m_fUseStrictMode = BVar4;
  }
  ProcessCapturedNames(this,pnodeFnc);
  uVar13 = local_34;
  if (bVar17) {
    *ppPVar1 = (ParseNodePtr)0x0;
  }
  if ((pnodeFnc->fncFlags & kFunctionAsmjsMode) != kFunctionNone) {
    this->m_InAsmMode = false;
  }
  if (this->m_pstmtCur != (StmtNest *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x17ee,"(nullptr == m_pstmtCur)","nullptr == m_pstmtCur");
    if (!bVar16) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  this->m_pstmtCur = pSVar9;
  if (local_50 != (ParseNodeBlock *)0x0) {
    FinishParseFncExprScope(this,pnodeFnc,local_50);
  }
  uVar19 = uVar5 & 0x10 | this->m_grfscr;
  this->m_grfscr = uVar19;
  if (this->m_stoppedDeferredParse == 0) {
    this->m_grfscr = uVar19 | uVar5 & 8;
  }
  (this->m_scan).m_fYieldIsKeywordRegion = bVar15;
  (this->m_scan).m_fAwaitIsKeywordRegion = bVar3;
  if (this->m_currentNodeDeferredFunc != pnodeFnc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x180e,"(pnodeFnc == m_currentNodeDeferredFunc)",
                        "pnodeFnc == m_currentNodeDeferredFunc");
    if (!bVar15) goto LAB_00cf7ef5;
    *puVar20 = 0;
  }
  if ((uVar13 & 0x10) == 0) {
    if (this->m_currentNodeNonLambdaDeferredFunc != pnodeFnc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar20 = 1;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1811,"(pnodeFnc == m_currentNodeNonLambdaDeferredFunc)",
                          "pnodeFnc == m_currentNodeNonLambdaDeferredFunc");
      if (!bVar15) {
LAB_00cf7ef5:
        pcVar12 = (code *)invalidInstructionException();
        (*pcVar12)();
      }
      *puVar20 = 0;
    }
    this->m_currentNodeNonLambdaDeferredFunc = pPVar22;
  }
  this->m_currentNodeDeferredFunc = pnodeFncParent;
  if ((this->m_currentNodeFunc != (ParseNodeFnc *)0x0) &&
     ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone)) {
    pPVar22 = GetCurrentFunctionNode(this);
    pbVar2 = (byte *)((long)&pPVar22->fncFlags + 1);
    *pbVar2 = *pbVar2 | 0x10;
  }
  this->m_doingFastScan = local_35;
  return;
}

Assistant:

void Parser::ParseFncDeclHelper(ParseNodeFnc * pnodeFnc, LPCOLESTR pNameHint, ushort flags, bool fUnaryOrParen, bool noStmtContext, bool *pNeedScanRCurly, bool skipFormals, IdentPtr* pFncNamePid, bool fAllowIn)
{
    Assert(pnodeFnc);
    ParseNodeFnc * pnodeFncParent = GetCurrentFunctionNode();
    // is the following correct? When buildAST is false, m_currentNodeDeferredFunc can be nullptr on transition to deferred parse from non-deferred
    ParseNodeFnc * pnodeFncSave = buildAST ? m_currentNodeFunc : m_currentNodeDeferredFunc;
    ParseNodeFnc * pnodeFncSaveNonLambda = buildAST ? m_currentNodeNonLambdaFunc : m_currentNodeNonLambdaDeferredFunc;
    int32* pAstSizeSave = m_pCurrentAstSize;

    bool fDeclaration = (flags & fFncDeclaration) != 0;
    bool fLambda = (flags & fFncLambda) != 0;
    bool fAsync = (flags & fFncAsync) != 0;
    bool fModule = (flags & fFncModule) != 0;
    bool fDeferred = false;
    StmtNest *pstmtSave;
    bool fFunctionInBlock = false;

    if (buildAST)
    {
        fFunctionInBlock = GetCurrentBlockInfo() != GetCurrentFunctionBlockInfo() &&
            (GetCurrentBlockInfo()->pnodeBlock->scope == nullptr ||
                GetCurrentBlockInfo()->pnodeBlock->scope->GetScopeType() != ScopeType_GlobalEvalBlock);
    }

    // Save the position of the scanner in case we need to inspect the name hint later
    RestorePoint beginNameHint;
    this->GetScanner()->Capture(&beginNameHint);

    ParseNodeBlock * pnodeFncExprScope = nullptr;
    Scope *fncExprScope = nullptr;
    if (!fDeclaration)
    {
        if (!fLambda)
        {
            pnodeFncExprScope = StartParseBlock<buildAST>(PnodeBlockType::Function, ScopeType_FuncExpr);
            fncExprScope = pnodeFncExprScope->scope;
        }

        // Function expression: push the new function onto the stack now so that the name (if any) will be
        // local to the new function.

        this->UpdateCurrentNodeFunc<buildAST>(pnodeFnc, fLambda);
    }

    if (!fLambda && !fModule)
    {
        this->ParseFncName<buildAST>(pnodeFnc, flags, pFncNamePid);
    }

    if (fDeclaration)
    {
        // Declaration statement: push the new function now, after parsing the name, so the name is local to the
        // enclosing function.

        this->UpdateCurrentNodeFunc<buildAST>(pnodeFnc, fLambda);
    }

    if (noStmtContext && pnodeFnc->IsGenerator())
    {
        // Generator decl not allowed outside stmt context. (We have to wait until we've parsed the '*' to
        // detect generator.)
        Error(ERRsyntax, pnodeFnc);
    }

    // switch scanner to treat 'yield' as keyword in generator functions
    // or as an identifier in non-generator functions
    bool fPreviousYieldIsKeyword = this->GetScanner()->SetYieldIsKeywordRegion(pnodeFnc->IsGenerator());
    bool fPreviousAwaitIsKeyword = this->GetScanner()->SetAwaitIsKeywordRegion(fAsync);

    if (pnodeFnc->IsGenerator())
    {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Generator, m_scriptContext);
    }

    if (fncExprScope && pnodeFnc->pnodeName == nullptr)
    {
        FinishParseBlock(pnodeFncExprScope);
        m_nextBlockId--;
        Adelete(&m_nodeAllocator, fncExprScope);
        fncExprScope = nullptr;
        pnodeFncExprScope = nullptr;
    }

    pnodeFnc->scope = fncExprScope;

    // Start a new statement stack.
    bool topLevelStmt =
        buildAST &&
        !fFunctionInBlock &&
        (this->m_pstmtCur == nullptr || this->m_pstmtCur->pnodeStmt->nop == knopBlock);

    pstmtSave = m_pstmtCur;
    SetCurrentStatement(nullptr);

    RestorePoint beginFormals;
    this->GetScanner()->Capture(&beginFormals);
    BOOL fWasAlreadyStrictMode = IsStrictMode();
    BOOL oldStrictMode = this->m_fUseStrictMode;

    if (fLambda)
    {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Lambda, m_scriptContext);
    }

    uint uCanDeferSave = m_grfscr & fscrCanDeferFncParse;
    uint uDeferSave = m_grfscr & fscrWillDeferFncParse;
    bool isTopLevelDeferredFunc = false;

#if ENABLE_BACKGROUND_PARSING
    struct AutoFastScanFlag {
        bool savedDoingFastScan;
        AutoFastScanFlag(Parser *parser) : m_parser(parser) { savedDoingFastScan = m_parser->m_doingFastScan; }
        ~AutoFastScanFlag() { m_parser->m_doingFastScan = savedDoingFastScan; }
        Parser *m_parser;
    } flag(this);
#endif

    bool doParallel = false;
#if ENABLE_BACKGROUND_PARSING
    bool parallelJobStarted = false;
#endif
    if (buildAST)
    {
        bool isLikelyIIFE = !fDeclaration && fUnaryOrParen;

        BOOL isDeferredFnc = IsDeferredFnc();
        // These are the conditions that prohibit upfront deferral *and* redeferral.
        isTopLevelDeferredFunc = 
                (m_grfscr & fscrCanDeferFncParse)
                && !m_InAsmMode
                // Don't defer a module function wrapper because we need to do export resolution at parse time
                && !fModule;

        pnodeFnc->SetCanBeDeferred(isTopLevelDeferredFunc && ParseNodeFnc::CanBeRedeferred(pnodeFnc->fncFlags));

        // These are heuristic conditions that prohibit upfront deferral but not redeferral.
        isTopLevelDeferredFunc = isTopLevelDeferredFunc && !isDeferredFnc && WillDeferParse(pnodeFnc->functionId) &&
            (!isLikelyIIFE || !topLevelStmt || PHASE_FORCE_RAW(Js::DeferParsePhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId));

#if ENABLE_BACKGROUND_PARSING
        if (!fLambda &&
            !isDeferredFnc &&
            !isLikelyIIFE &&
            !this->IsBackgroundParser() &&
            !this->m_doingFastScan &&
            !(pnodeFncSave && m_currDeferredStub) &&
            !(this->m_parseType == ParseType_Deferred && this->m_functionBody && this->m_functionBody->GetScopeInfo() && !isTopLevelDeferredFunc))
        {
            doParallel = DoParallelParse(pnodeFnc);

            if (doParallel)
            {
                BackgroundParser *bgp = m_scriptContext->GetBackgroundParser();
                Assert(bgp);
                if (bgp->HasFailedBackgroundParseItem())
                {
                    Error(ERRsyntax);
                }
                doParallel = bgp->ParseBackgroundItem(this, pnodeFnc, isTopLevelDeferredFunc);
                if (doParallel)
                {
                    parallelJobStarted = true;
                    this->m_hasParallelJob = true;
                    this->m_doingFastScan = true;
                    doParallel = FastScanFormalsAndBody();
                    if (doParallel)
                    {
                        // Let the foreground thread take care of marking the limit on the function node,
                        // because in some cases this function's caller will want to change that limit,
                        // so we don't want the background thread to try and touch it.
                        pnodeFnc->ichLim = this->GetScanner()->IchLimTok();
                        pnodeFnc->cbLim = this->GetScanner()->IecpLimTok();
                    }
                }
            }
        }
#endif
    }

    if (!doParallel)
    {
#if ENABLE_BACKGROUND_PARSING
        // We don't want to, or couldn't, let the main thread scan past this function body, so parse
        // it for real.
        ParseNodeFnc * pnodeRealFnc = pnodeFnc;
        if (parallelJobStarted)
        {
            // We have to deal with a failure to fast-scan the function (due to syntax error? "/"?) when
            // a background thread may already have begun to work on the job. Both threads can't be allowed to
            // operate on the same node.
            pnodeFnc = CreateDummyFuncNode(fDeclaration);
        }
#endif

        AnalysisAssert(pnodeFnc);
        ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Parameter, ScopeType_Parameter);
        AnalysisAssert(pnodeBlock != nullptr);
        pnodeFnc->pnodeScopes = pnodeBlock;
        m_ppnodeVar = &pnodeFnc->pnodeParams;
        pnodeFnc->pnodeVars = nullptr;
        ParseNodePtr* varNodesList = &pnodeFnc->pnodeVars;
        ParseNodeVar * argNode = nullptr;

        if (!fModule && !fLambda)
        {
            ParseNodePtr *const ppnodeVarSave = m_ppnodeVar;
            m_ppnodeVar = &pnodeFnc->pnodeVars;

            // Create the built-in arguments symbol
            argNode = this->AddArgumentsNodeToVars(pnodeFnc);

            // Save the updated var list
            varNodesList = m_ppnodeVar;
            m_ppnodeVar = ppnodeVarSave;
        }

        ParseNodePtr *ppnodeScopeSave = nullptr;
        ParseNodePtr *ppnodeExprScopeSave = nullptr;

        ppnodeScopeSave = m_ppnodeScope;
        if (pnodeBlock)
        {
            // This synthetic block scope will contain all the nested scopes.
            m_ppnodeScope = &pnodeBlock->pnodeScopes;
            pnodeBlock->pnodeStmt = pnodeFnc;
        }

        // Keep nested function declarations and expressions in the same list at function scope.
        // (Indicate this by nulling out the current function expressions list.)
        ppnodeExprScopeSave = m_ppnodeExprScope;
        m_ppnodeExprScope = nullptr;

        uint parenExprDepthSave = m_funcParenExprDepth;
        m_funcParenExprDepth = 0;

        if (!skipFormals)
        {
            bool fLambdaParamsSave = m_reparsingLambdaParams;
            if (fLambda)
            {
                m_reparsingLambdaParams = true;
            }

            uint savedStubCount = m_currDeferredStubCount;
            DeferredFunctionStub* savedStub = m_currDeferredStub;
            ShiftCurrDeferredStubToChildFunction(pnodeFnc, pnodeFncParent);

            this->ParseFncFormals<buildAST>(pnodeFnc, pnodeFncParent, flags, isTopLevelDeferredFunc);

            m_currDeferredStub = savedStub;
            m_currDeferredStubCount = savedStubCount;

            m_reparsingLambdaParams = fLambdaParamsSave;
        }

        // Create function body scope
        ParseNodeBlock * pnodeInnerBlock = StartParseBlock<buildAST>(PnodeBlockType::Function, ScopeType_FunctionBody);
        // Set the parameter block's child to the function body block.
        // The pnodeFnc->pnodeScopes list is constructed in such a way that it includes all the scopes in this list.
        // For example if the param scope has one function and body scope has one function then the list will look like below,
        // param scope block -> function decl from param scope -> body socpe block -> function decl from body scope.
        *m_ppnodeScope = pnodeInnerBlock;
        pnodeFnc->pnodeBodyScope = pnodeInnerBlock;

        // This synthetic block scope will contain all the nested scopes.
        m_ppnodeScope = &pnodeInnerBlock->pnodeScopes;
        pnodeInnerBlock->pnodeStmt = pnodeFnc;

        // DEFER: Begin deferral here (after names are parsed and name nodes created).
        // Create no more AST nodes until we're done.

        // Try to defer this func if all these are true:
        //  0. We are not already in deferred parsing (i.e. buildAST is true)
        //  1. We are not re-parsing a deferred func which is being invoked.
        //  2. Dynamic profile suggests this func can be deferred (and deferred parse is on).
        //  3. This func is top level or defer nested func is on.
        //  4. Optionally, the function is non-nested and not in eval, or the deferral decision was based on cached profile info,
        //     or the function is sufficiently long. (I.e., don't defer little nested functions unless we're
        //     confident they'll never be executed, because un-deferring nested functions is more expensive.)
        //     NOTE: I'm disabling #4 by default, because we've found other ways to reduce the cost of un-deferral,
        //           and we don't want to create function bodies aggressively for little functions.

        // We will also temporarily defer all asm.js functions, except for the asm.js
        // module itself, which we will never defer
        bool strictModeTurnedOn = false;

        if (isTopLevelDeferredFunc &&
            !(this->m_grfscr & fscrEvalCode) &&
            pnodeFnc->IsNested() &&
#ifndef DISABLE_DYNAMIC_PROFILE_DEFER_PARSE
            m_sourceContextInfo->sourceDynamicProfileManager == nullptr &&
#endif
            PHASE_ON_RAW(Js::ScanAheadPhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId) &&
            (
                !PHASE_FORCE_RAW(Js::DeferParsePhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId) ||
                PHASE_FORCE_RAW(Js::ScanAheadPhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId)
                ))
        {
            // Try to scan ahead to the end of the function. If we get there before we've scanned a minimum
            // number of tokens, don't bother deferring, because it's too small.
            if (this->ScanAheadToFunctionEnd(CONFIG_FLAG(MinDeferredFuncTokenCount)))
            {
                isTopLevelDeferredFunc = false;
            }
        }

        Scope* paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
        if (paramScope != nullptr)
        {
            if (CONFIG_FLAG(ForceSplitScope))
            {
                pnodeFnc->ResetBodyAndParamScopeMerged();
            }
            else if (pnodeFnc->HasNonSimpleParameterList() && pnodeFnc->IsBodyAndParamScopeMerged())
            {
                paramScope->ForEachSymbolUntil([this, paramScope, pnodeFnc](Symbol* sym) {
                    if (sym->GetPid()->GetTopRef()->GetFuncScopeId() > pnodeFnc->functionId)
                    {
                        // One of the symbol has non local reference. Mark the param scope as we can't merge it with body scope.
                        pnodeFnc->ResetBodyAndParamScopeMerged();
                        return true;
                    }
                    return false;
                });
            }
        }

        // If the param scope is merged with the body scope we want to use the param scope symbols in the body scope.
        // So add a pid ref for the body using the param scope symbol. Note that in this case the same symbol will occur twice
        // in the same pid ref stack.
        if (paramScope != nullptr && pnodeFnc->IsBodyAndParamScopeMerged())
        {
            paramScope->ForEachSymbol([this](Symbol* paramSym)
            {
                PidRefStack* ref = PushPidRef(paramSym->GetPid());
                ref->SetSym(paramSym);
            });
        }

        AssertMsg(m_funcParenExprDepth == 0, "Paren exprs should have been resolved by the time we finish function formals");

        if (fLambda)
        {
#ifdef ASMJS_PLAT
            if (m_InAsmMode && (isTopLevelDeferredFunc && m_deferAsmJs))
            {
                // asm.js doesn't support lambda functions
                Js::AsmJSCompiler::OutputError(m_scriptContext, _u("Lambda functions are not supported."));
                Js::AsmJSCompiler::OutputError(m_scriptContext, _u("Asm.js compilation failed."));
                throw Js::AsmJsParseException();
            }
#endif
        }

        if (m_token.tk == tkRParen)
        {
            this->GetScanner()->Scan();
        }

        if (fLambda)
        {
            BOOL hadNewLine = this->GetScanner()->FHadNewLine();

            // it can be the case we do not have a fat arrow here if there is a valid expression on the left hand side
            // of the fat arrow, but that expression does not parse as a parameter list.  E.g.
            //    a.x => { }
            // Therefore check for it and error if not found.
            ChkCurTok(tkDArrow, ERRnoDArrow);

            // Newline character between arrow parameters and fat arrow is a syntax error but we want to check for
            // this after verifying there was a => token. Otherwise we would throw the wrong error.
            if (hadNewLine)
            {
                Error(ERRValidIfFollowedBy, _u("Lambda parameter list"), _u("'=>' on the same line"));
            }
        }

        if (isTopLevelDeferredFunc || (m_InAsmMode && m_deferAsmJs))
        {
            fDeferred = true;

            this->ParseTopLevelDeferredFunc(pnodeFnc, pnodeFncSave, pNameHint, fLambda, pNeedScanRCurly, fAllowIn);
        }
        else
        {
            AnalysisAssert(pnodeFnc);

            // Shouldn't be any temps in the arg list.
            Assert(*m_ppnodeVar == nullptr);

            // Start the var list.
            m_ppnodeVar = varNodesList;

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ParsePhase, _u("The param and body scope of the function %s cannot be merged\n"), pnodeFnc->pnodeName ? pnodeFnc->pnodeName->pid->Psz() : _u("Anonymous function"));
            }

            // Keep nested function declarations and expressions in the same list at function scope.
            // (Indicate this by nulling out the current function expressions list.)
            m_ppnodeExprScope = nullptr;

            if (buildAST)
            {
                if (m_token.tk != tkLCurly && fLambda)
                {
                    *pNeedScanRCurly = false;
                }
                uint savedStubCount = m_currDeferredStubCount;
                DeferredFunctionStub* savedStub = m_currDeferredStub;
                ShiftCurrDeferredStubToChildFunction(pnodeFnc, pnodeFncSave);

                this->FinishFncDecl(pnodeFnc, pNameHint, fLambda, skipFormals, fAllowIn);

                m_currDeferredStub = savedStub;
                m_currDeferredStubCount = savedStubCount;
            }
            else
            {
                this->ParseNestedDeferredFunc(pnodeFnc, fLambda, pNeedScanRCurly, &strictModeTurnedOn, fAllowIn);
            }
        }

        // Restore the paren count for any outer spread/rest error checking.
        m_funcParenExprDepth = parenExprDepthSave;

        if (pnodeInnerBlock)
        {
            FinishParseBlock(pnodeInnerBlock, *pNeedScanRCurly);
        }

        if (!fModule && (m_token.tk == tkLCurly || !fLambda))
        {
            UpdateArgumentsNode(pnodeFnc, argNode);
        }

        CreateSpecialSymbolDeclarations(pnodeFnc);

        // Restore the lists of scopes that contain function expressions.

        Assert(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr);
        m_ppnodeExprScope = ppnodeExprScopeSave;

        Assert(m_ppnodeScope);
        Assert(nullptr == *m_ppnodeScope);
        m_ppnodeScope = ppnodeScopeSave;

        if (pnodeBlock)
        {
            FinishParseBlock(pnodeBlock, *pNeedScanRCurly);
        }

        if (IsStrictMode() || strictModeTurnedOn)
        {
            this->m_fUseStrictMode = TRUE; // Now we know this function is in strict mode

            if (!fWasAlreadyStrictMode)
            {
                // If this function turned on strict mode then we didn't check the formal
                // parameters or function name hint for future reserved word usage. So do that now.
                RestorePoint afterFnc;
                this->GetScanner()->Capture(&afterFnc);

                if (pnodeFnc->pnodeName != nullptr)
                {
                    // Rewind to the function name hint and check if the token is a reserved word.
                    this->GetScanner()->SeekTo(beginNameHint);
                    this->GetScanner()->Scan();
                    if (pnodeFnc->IsGenerator())
                    {
                        Assert(m_token.tk == tkStar);
                        Assert(m_scriptContext->GetConfig()->IsES6GeneratorsEnabled());
                        Assert(!(flags & fFncClassMember));
                        this->GetScanner()->Scan();
                    }
                    if (m_token.IsReservedWord())
                    {
                        IdentifierExpectedError(m_token);
                    }
                    CheckStrictModeEvalArgumentsUsage(m_token.GetIdentifier(this->GetHashTbl()));
                }

                // Fast forward to formal parameter list, check for future reserved words,
                // then restore scanner as it was.
                this->GetScanner()->SeekToForcingPid(beginFormals);
                CheckStrictFormalParameters();
                this->GetScanner()->SeekTo(afterFnc);
            }

            if (buildAST)
            {
                if (pnodeFnc->pnodeName != nullptr)
                {
                    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
                    CheckStrictModeEvalArgumentsUsage(pnodeFnc->pnodeName->pid, pnodeFnc->pnodeName);
                }
            }

            this->m_fUseStrictMode = oldStrictMode;
            CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StrictModeFunction, m_scriptContext);
        }

        ProcessCapturedNames(pnodeFnc);

        if (fDeferred)
        {
            AnalysisAssert(pnodeFnc);
            pnodeFnc->pnodeVars = nullptr;
        }

#if ENABLE_BACKGROUND_PARSING
        if (parallelJobStarted)
        {
            pnodeFnc = pnodeRealFnc;
            m_currentNodeFunc = pnodeRealFnc;

            // Let the foreground thread take care of marking the limit on the function node,
            // because in some cases this function's caller will want to change that limit,
            // so we don't want the background thread to try and touch it.
            pnodeFnc->ichLim = this->GetScanner()->IchLimTok();
            pnodeFnc->cbLim = this->GetScanner()->IecpLimTok();
        }
#endif
    }

    // after parsing asm.js module, we want to reset asm.js state before continuing
    AnalysisAssert(pnodeFnc);
    if (pnodeFnc->GetAsmjsMode())
    {
        m_InAsmMode = false;
    }

    // Restore the statement stack.
    Assert(nullptr == m_pstmtCur);
    SetCurrentStatement(pstmtSave);

    if (pnodeFncExprScope)
    {
        FinishParseFncExprScope(pnodeFnc, pnodeFncExprScope);
    }
    m_grfscr |= uCanDeferSave;
    if (!m_stoppedDeferredParse)
    {
        m_grfscr |= uDeferSave;
    }

    this->GetScanner()->SetYieldIsKeywordRegion(fPreviousYieldIsKeyword);
    this->GetScanner()->SetAwaitIsKeywordRegion(fPreviousAwaitIsKeyword);

    // Restore the current function.
    if (buildAST)
    {
        Assert(pnodeFnc == m_currentNodeFunc);

        m_currentNodeFunc = pnodeFncSave;
        m_pCurrentAstSize = pAstSizeSave;

        if (!fLambda)
        {
            Assert(pnodeFnc == m_currentNodeNonLambdaFunc);
            m_currentNodeNonLambdaFunc = pnodeFncSaveNonLambda;
        }
    }
    else
    {
        Assert(pnodeFnc == m_currentNodeDeferredFunc);
        if (!fLambda)
        {
            Assert(pnodeFnc == m_currentNodeNonLambdaDeferredFunc);
            m_currentNodeNonLambdaDeferredFunc = pnodeFncSaveNonLambda;
        }
        m_currentNodeDeferredFunc = pnodeFncSave;
    }

    if (m_currentNodeFunc && pnodeFnc->HasWithStmt())
    {
        GetCurrentFunctionNode()->SetHasWithStmt(true);
    }
}